

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetObjectFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *config)

{
  ulong uVar1;
  cmGlobalNinjaGenerator *pcVar2;
  char local_109;
  string local_108;
  cmAlphaNum local_e8;
  string local_b8;
  cmAlphaNum local_98;
  string local_68;
  string *local_48;
  string *objectName;
  undefined1 local_29;
  string *local_28;
  string *config_local;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  string *path;
  
  local_29 = 0;
  local_28 = config;
  config_local = (string *)source;
  source_local = (cmSourceFile *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  cmLocalNinjaGenerator::GetHomeRelativeOutputPath_abi_cxx11_
            (__return_storage_ptr__,this->LocalGenerator);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
  }
  local_48 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,
                        (cmSourceFile *)config_local);
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xe])
            (&local_b8,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  cmAlphaNum::cmAlphaNum(&local_98,&local_b8);
  pcVar2 = GetGlobalGenerator(this);
  (*(pcVar2->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            (&local_108,pcVar2,local_28);
  cmAlphaNum::cmAlphaNum(&local_e8,&local_108);
  local_109 = '/';
  cmStrCat<char,std::__cxx11::string>(&local_68,&local_98,&local_e8,&local_109,local_48);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetObjectFilePath(
  cmSourceFile const* source, const std::string& config) const
{
  std::string path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += '/';
  }
  std::string const& objectName = this->GeneratorTarget->GetObjectName(source);
  path += cmStrCat(
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
    this->GetGlobalGenerator()->ConfigDirectory(config), '/', objectName);
  return path;
}